

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_session.c
# Opt level: O3

ssize_t dlep_session_process_signal(dlep_session *session,void *ptr,size_t length,_Bool is_udp)

{
  size_t *psVar1;
  dlep_extension *pdVar2;
  undefined2 uVar3;
  oonf_log_source oVar4;
  dlep_signals dVar5;
  undefined4 uVar6;
  uint uVar7;
  ushort uVar8;
  int iVar9;
  undefined8 uVar10;
  list_entity *plVar11;
  ulong uVar12;
  long lVar13;
  dlep_parser_value *pdVar14;
  avl_tree *paVar15;
  list_entity *plVar16;
  byte bVar17;
  size_t sVar18;
  list_entity *plVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  list_entity *plVar22;
  list_entity *plVar23;
  list_entity *plVar24;
  ushort uVar25;
  ulong uVar26;
  int32_t iVar27;
  size_t sVar28;
  ulong uVar29;
  ulong uVar30;
  size_t __size;
  char *pcVar31;
  ushort local_aa;
  ulong local_a8;
  uint8_t *local_a0;
  dlep_session_parser *local_98;
  size_t local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  netaddr_str nbuf;
  
  session->next_restrict_signal = DLEP_KEEP_RESTRICTION;
  if (length < 4) {
    oVar4 = session->log_source;
    if (((&log_global_mask)[oVar4] & 1) != 0) {
      uVar10 = netaddr_socket_to_string(&nbuf,&session->remote_socket);
      oonf_log(1,(ulong)oVar4,"src/generic/dlep/dlep_session.c",0x186,0,0,
               "Not enough data to process signal from %s (%zu bytes)",uVar10,length);
      return 0;
    }
  }
  else {
    uVar25 = *(ushort *)((long)ptr + 2);
    uVar8 = *ptr << 8 | *ptr >> 8;
    uVar7 = uVar8 + 0x10000;
    if (!is_udp) {
      uVar7 = (uint)uVar8;
    }
    uVar29 = (ulong)uVar7;
    uVar12 = (ulong)(ushort)(uVar25 << 8 | uVar25 >> 8);
    uVar26 = uVar12 + 4;
    uVar30 = (ulong)session->log_source;
    if (uVar26 <= length) {
      local_a8 = uVar29;
      if (((&log_global_mask)[uVar30] & 1) != 0) {
        uVar10 = netaddr_socket_to_string(&nbuf,&session->remote_socket);
        oonf_log(1,uVar30,"src/generic/dlep/dlep_session.c",0x1a3,ptr,uVar26,
                 "Process signal %d from %s (%zu bytes)",local_a8,uVar10,length);
      }
      dVar5 = session->restrict_signal;
      uVar29 = (ulong)(uint)dVar5;
      if ((dVar5 != DLEP_ALL_SIGNALS) && (dVar5 != (dlep_signals)local_a8)) {
        uVar26 = (ulong)session->log_source;
        if (((&log_global_mask)[uVar26] & 1) == 0) {
          return -1;
        }
        uVar10 = 0x1a9;
        pcVar31 = "Signal should have been %d, drop session";
LAB_0011c5cf:
        oonf_log(1,uVar26,"src/generic/dlep/dlep_session.c",uVar10,0,0,pcVar31,uVar29);
        return -1;
      }
      (session->parser).tlv_ptr = (uint8_t *)((long)ptr + 4);
      for (plVar11 = (session->parser).allowed_tlvs.list_head.next;
          plVar11->prev != (session->parser).allowed_tlvs.list_head.prev; plVar11 = plVar11->next) {
        *(undefined8 *)((long)&plVar11[-2].prev + 4) = 0xffffffffffffffff;
      }
      local_98 = &session->parser;
      if (uVar25 != 0) {
        __size = 0x400;
        sVar28 = 0;
        uVar29 = 0;
        local_a0 = (uint8_t *)((long)ptr + 4);
        local_88 = uVar12;
        do {
          if (local_88 - uVar29 < 4) {
            uVar10 = 0xfffffffe;
LAB_0011cbef:
            uVar12 = (ulong)session->log_source;
            if (((&log_global_mask)[uVar12] & 1) != 0) {
              pcVar31 = "parse_tlvstream result: %d";
              uVar20 = 0x329;
              uVar21 = uVar10;
LAB_0011cc1e:
              oonf_log(1,uVar12,"src/generic/dlep/dlep_session.c",uVar20,0,0,pcVar31,uVar21);
            }
LAB_0011cc2e:
            if (((&log_global_mask)[session->log_source] & 4) != 0) {
              oonf_log(4,(ulong)session->log_source,"src/generic/dlep/dlep_session.c",0x1b5,0,0,
                       "Parser error: %d",uVar10);
            }
            if ((uint)(session->restrict_signal + ~DLEP_IS_UDP_SIGNAL) < 2) {
              return uVar26;
            }
            dlep_session_generate_signal_status
                      (session,5,(oonf_layer2_neigh_key *)0x0,DLEP_STATUS_INVALID_DATA,
                       "Incoming signal could not be parsed");
            session->restrict_signal = DLEP_SESSION_TERMINATION_ACK;
            session->next_restrict_signal = DLEP_SESSION_TERMINATION_ACK;
            return uVar26;
          }
          uVar25 = *(ushort *)(local_a0 + uVar29) << 8 | *(ushort *)(local_a0 + uVar29) >> 8;
          uVar8 = *(ushort *)(local_a0 + uVar29 + 2) << 8 | *(ushort *)(local_a0 + uVar29 + 2) >> 8;
          uVar12 = uVar29 + uVar8 + 4;
          if (local_88 < uVar12) {
            uVar10 = 0xfffffffd;
            if (((&log_global_mask)[session->log_source] & 4) != 0) {
              oonf_log(4,(ulong)session->log_source,"src/generic/dlep/dlep_session.c",0x381,0,0,
                       "TLV %u incomplete: %zu > %zu",uVar25,uVar12,local_88);
            }
            goto LAB_0011cbef;
          }
          local_aa = uVar25;
          local_90 = sVar28;
          local_80 = (ulong)uVar8;
          local_78 = uVar12;
          lVar13 = avl_find(local_98,&local_aa);
          if (lVar13 == 0) {
            uVar10 = 0xfffffffc;
            if (((&log_global_mask)[session->log_source] & 2) != 0) {
              oonf_log(2,(ulong)session->log_source,"src/generic/dlep/dlep_session.c",0x388,0,0,
                       "Unsupported TLV %u",uVar25);
            }
            goto LAB_0011cbef;
          }
          if ((*(ushort *)(lVar13 + -10) < uVar8) || (uVar8 < *(ushort *)(lVar13 + -0xc))) {
            uVar10 = 0xfffffffb;
            if (((&log_global_mask)[session->log_source] & 4) != 0) {
              oonf_log(4,(ulong)session->log_source,"src/generic/dlep/dlep_session.c",0x391,0,0,
                       "TLV %u has wrong size, %d is not between %u and %u",uVar25,local_80,
                       *(undefined2 *)(lVar13 + -0xc),*(ushort *)(lVar13 + -10));
            }
            goto LAB_0011cbef;
          }
          if (local_90 == (session->parser).value_max_count) {
            pdVar14 = (dlep_parser_value *)realloc((session->parser).values,__size);
            if (pdVar14 == (dlep_parser_value *)0x0) {
              uVar10 = 0xfffffff8;
              goto LAB_0011cbef;
            }
            psVar1 = &(session->parser).value_max_count;
            *psVar1 = *psVar1 + 0x80;
            (session->parser).values = pdVar14;
          }
          if (((&log_global_mask)[session->log_source] & 1) != 0) {
            oonf_log(1,(ulong)session->log_source,"src/generic/dlep/dlep_session.c",0x3a0,
                     local_a0 + uVar29 + 4,local_80,"Received TLV %u",uVar25);
          }
          pdVar14 = (session->parser).values;
          *(undefined4 *)((long)&pdVar14[-0x80].tlv_next + __size) = 0xffffffff;
          *(short *)((long)pdVar14 + (__size - 0x3fc)) = (short)(uVar29 + 4);
          *(ushort *)((long)pdVar14 + (__size - 0x3fa)) = uVar8;
          iVar27 = (int32_t)local_90;
          if ((long)*(int *)(lVar13 + -0x10) == -1) {
            *(int32_t *)(lVar13 + -0x14) = iVar27;
          }
          else {
            (session->parser).values[*(int *)(lVar13 + -0x10)].tlv_next = iVar27;
          }
          *(int32_t *)(lVar13 + -0x10) = iVar27;
          sVar28 = local_90 + 1;
          __size = __size + 8;
          uVar29 = local_78;
        } while (local_78 < local_88);
      }
      paVar15 = dlep_extension_get_tree();
      plVar11 = (paVar15->list_head).next;
      plVar16 = plVar11->prev;
      paVar15 = dlep_extension_get_tree();
      if (plVar16 == (paVar15->list_head).prev) {
LAB_0011c9bd:
        if (session->next_restrict_signal == DLEP_KEEP_RESTRICTION) {
          return uVar26;
        }
        session->restrict_signal = session->next_restrict_signal;
        return uVar26;
      }
LAB_0011c7d3:
      sVar28 = (session->parser).extension_count;
      iVar9 = (int)local_a8;
      if (sVar28 != 0) {
        pdVar2 = (dlep_extension *)(plVar11 + -9);
        sVar18 = 0;
        do {
          if ((session->parser).extensions[sVar18] == pdVar2) {
            plVar16 = plVar11[-8].prev;
            if (plVar16 != (list_entity *)0x0) {
              plVar19 = plVar11[-8].next;
              plVar23 = plVar19 + 2;
              plVar22 = plVar16;
              goto LAB_0011c822;
            }
            break;
          }
          sVar18 = sVar18 + 1;
        } while (sVar28 != sVar18);
      }
      goto LAB_0011c9a7;
    }
    if (((&log_global_mask)[uVar30] & 1) != 0) {
      uVar10 = netaddr_socket_to_string(&nbuf,&session->remote_socket);
      oonf_log(1,uVar30,"src/generic/dlep/dlep_session.c",0x19d,0,0,
               "Not enough data to process signal %u (length %u) from %s (%zu bytes)",uVar29,uVar12,
               uVar10,length);
      return 0;
    }
  }
  return 0;
  while( true ) {
    plVar23 = (list_entity *)&plVar23[5].prev;
    plVar22 = (list_entity *)((long)&plVar22[-1].prev + 7);
    if (plVar22 == (list_entity *)0x0) break;
LAB_0011c822:
    if (*(int *)&plVar23[-2].next == iVar9) {
      if (plVar23->next == (list_entity *)0x0) goto LAB_0011c88a;
      plVar16 = (list_entity *)0x0;
      goto LAB_0011c847;
    }
  }
  goto LAB_0011c8a3;
  while( true ) {
    if (*(int *)(lVar13 + -0x14) == -1) {
      uVar12 = (ulong)session->log_source;
      uVar10 = 0xfffffffa;
      if (((&log_global_mask)[uVar12] & 4) != 0) {
        uVar3 = *(undefined2 *)((long)&(plVar23[-1].prev)->next + (long)plVar16 * 2);
        uVar6 = pdVar2->id;
        pcVar31 = "Missing mandatory TLV %u in extension %d";
        uVar21 = 0x3e4;
        goto LAB_0011cd50;
      }
      goto LAB_0011cd6c;
    }
    plVar16 = (list_entity *)((long)&plVar16->next + 1);
    if (plVar23->next <= plVar16) break;
LAB_0011c847:
    local_aa = *(ushort *)((long)&(plVar23[-1].prev)->next + (long)plVar16 * 2);
    lVar13 = avl_find(local_98,&local_aa);
    if (lVar13 == 0) {
      uVar12 = (ulong)session->log_source;
      uVar10 = 0xfffffff7;
      if (((&log_global_mask)[uVar12] & 4) != 0) {
        uVar3 = *(undefined2 *)((long)&(plVar23[-1].prev)->next + (long)plVar16 * 2);
        uVar6 = pdVar2->id;
        pcVar31 = "Could not find tlv data for mandatory TLV %u in extension %d";
        uVar21 = 0x3dc;
LAB_0011cd50:
        oonf_log(4,uVar12,"src/generic/dlep/dlep_session.c",uVar21,0,0,pcVar31,uVar3,uVar6);
      }
LAB_0011cd6c:
      uVar12 = (ulong)session->log_source;
      if (((&log_global_mask)[uVar12] & 1) == 0) goto LAB_0011cc2e;
      pcVar31 = "check_mandatory result: %d";
      uVar20 = 0x30a;
      uVar21 = uVar10;
      goto LAB_0011cc1e;
    }
  }
  plVar16 = plVar11[-8].prev;
  iVar9 = (int)local_a8;
LAB_0011c88a:
  if (plVar16 == (list_entity *)0x0) goto LAB_0011c9a7;
  plVar19 = plVar11[-8].next;
LAB_0011c8a3:
  plVar24 = (list_entity *)((long)plVar19 + ((long)plVar16 * 0x16 + -0x16) * 4);
  plVar23 = plVar19;
  plVar22 = plVar16;
  do {
    if (*(int *)&plVar23->next == iVar9) goto LAB_0011c8cf;
    plVar23 = (list_entity *)&plVar23[5].prev;
    plVar22 = (list_entity *)((long)&plVar22[-1].prev + 7);
  } while (plVar22 != (list_entity *)0x0);
  plVar23 = plVar24;
  if (plVar24 != (list_entity *)0x0) {
LAB_0011c8cf:
    if (plVar23[1].next != (list_entity *)0x0) {
      plVar16 = (list_entity *)0x0;
      do {
        lVar13 = avl_find(local_98,(long)&plVar23->prev->next + (long)plVar16 * 2);
        if ((lVar13 != 0) && (*(int *)(lVar13 + -0x14) != *(int *)(lVar13 + -0x10))) {
          if (plVar23[3].next == (list_entity *)0x0) {
LAB_0011ca9d:
            uVar12 = (ulong)session->log_source;
            bVar17 = (&log_global_mask)[uVar12];
            if ((bVar17 & 4) != 0) {
              oonf_log(4,uVar12,"src/generic/dlep/dlep_session.c",0x41a,0,0,
                       "Duplicate not allowed for TLV %u in extension %d",
                       *(undefined2 *)(lVar13 + -0x18),pdVar2->id);
              uVar12 = (ulong)session->log_source;
              bVar17 = (&log_global_mask)[uVar12];
            }
            uVar10 = 0xfffffff9;
            if ((bVar17 & 1) == 0) goto LAB_0011cc2e;
            pcVar31 = "check_duplicate result: %d";
            uVar20 = 0x30e;
            uVar21 = 0xfffffffffffffff9;
            goto LAB_0011cc1e;
          }
          plVar19 = (list_entity *)0x0;
          while (*(short *)((long)&(plVar23[2].prev)->next + (long)plVar19 * 2) !=
                 *(short *)(lVar13 + -0x18)) {
            plVar19 = (list_entity *)((long)&plVar19->next + 1);
            if (plVar23[3].next == plVar19) goto LAB_0011ca9d;
          }
        }
        plVar16 = (list_entity *)((long)&plVar16->next + 1);
      } while (plVar16 < plVar23[1].next);
      plVar16 = plVar11[-8].prev;
      iVar9 = (int)local_a8;
    }
    if (plVar16 == (list_entity *)0x0) goto LAB_0011c9a7;
    plVar19 = plVar11[-8].next;
  }
  plVar19 = plVar19 + 4;
  do {
    if (*(int *)&plVar19[-4].next == iVar9) {
      if (session->radio == true) {
        if ((plVar19[-1].prev == (list_entity *)0x0) ||
           (iVar9 = (*(code *)plVar19[-1].prev)(pdVar2,session), iVar9 == 0)) break;
        uVar26 = (ulong)session->log_source;
        if (((&log_global_mask)[uVar26] & 1) != 0) {
          pcVar31 = "Error in radio signal processing of extension \'%s\'";
          uVar10 = 0x433;
LAB_0011ce0c:
          oonf_log(1,uVar26,"src/generic/dlep/dlep_session.c",uVar10,0,0,pcVar31,plVar11[-9].prev);
        }
      }
      else {
        if ((plVar19->next == (list_entity *)0x0) ||
           (iVar9 = (*(code *)plVar19->next)(pdVar2,session), iVar9 == 0)) break;
        uVar26 = (ulong)session->log_source;
        if (((&log_global_mask)[uVar26] & 1) != 0) {
          pcVar31 = "Error in router signal processing of extension \'%s\'";
          uVar10 = 0x439;
          goto LAB_0011ce0c;
        }
      }
      uVar26 = (ulong)session->log_source;
      if (((&log_global_mask)[uVar26] & 1) == 0) {
        return -1;
      }
      uVar10 = 0x313;
      uVar29 = 0xffffffffffffffff;
      pcVar31 = "extension processing failed: %d";
      goto LAB_0011c5cf;
    }
    plVar19 = (list_entity *)&plVar19[5].prev;
    plVar16 = (list_entity *)((long)&plVar16[-1].prev + 7);
  } while (plVar16 != (list_entity *)0x0);
LAB_0011c9a7:
  plVar11 = plVar11->next;
  plVar16 = plVar11->prev;
  paVar15 = dlep_extension_get_tree();
  if (plVar16 == (paVar15->list_head).prev) goto LAB_0011c9bd;
  goto LAB_0011c7d3;
}

Assistant:

ssize_t
dlep_session_process_signal(struct dlep_session *session, const void *ptr, size_t length, bool is_udp) {
  enum dlep_parser_error result;
  uint16_t original_signal_type;
  int32_t signal_type;
  uint16_t signal_length;
  const uint8_t *buffer;
#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str nbuf;
#endif

  session->next_restrict_signal = DLEP_KEEP_RESTRICTION;

  if (length < 4) {
    /* not enough data for a signal type */
    OONF_DEBUG(session->log_source,
      "Not enough data to process"
      " signal from %s (%" PRINTF_SIZE_T_SPECIFIER " bytes)",
      netaddr_socket_to_string(&nbuf, &session->remote_socket), length);

    return 0;
  }

  buffer = ptr;

  /* copy data */
  memcpy(&original_signal_type, &buffer[0], sizeof(original_signal_type));
  memcpy(&signal_length, &buffer[2], sizeof(signal_length));
  signal_type = ntohs(original_signal_type);
  signal_length = ntohs(signal_length);

  if (is_udp) {
    signal_type += DLEP_IS_UDP_SIGNAL;
  }

  if (length < (size_t)signal_length + 4u) {
    /* not enough data for signal */
    OONF_DEBUG(session->log_source,
      "Not enough data to process"
      " signal %u (length %u) from %s"
      " (%" PRINTF_SIZE_T_SPECIFIER " bytes)",
      signal_type, signal_length, netaddr_socket_to_string(&nbuf, &session->remote_socket), length);
    return 0;
  }

  OONF_DEBUG_HEX(session->log_source, buffer, signal_length + 4,
    "Process signal %d from %s (%" PRINTF_SIZE_T_SPECIFIER " bytes)", signal_type,
    netaddr_socket_to_string(&nbuf, &session->remote_socket), length);

  if (session->restrict_signal != DLEP_ALL_SIGNALS && session->restrict_signal != signal_type) {
    OONF_DEBUG(session->log_source,
      "Signal should have been %d,"
      " drop session",
      session->restrict_signal);
    /* we only accept a single type and we got the wrong one */
    return -1;
  }

  result = _process_tlvs(session, signal_type, signal_length, &buffer[4]);

  if (result == DLEP_NEW_PARSER_TERMINDATED) {
    /* session is now invalid, end parser */
    return result;
  }
  if (result != DLEP_NEW_PARSER_OKAY) {
    OONF_WARN(session->log_source, "Parser error: %d", result);
    _send_terminate(session, DLEP_STATUS_INVALID_DATA, "Incoming signal could not be parsed");
  }
  else if (session->next_restrict_signal != DLEP_KEEP_RESTRICTION) {
    session->restrict_signal = session->next_restrict_signal;
  }

  /* skip forward */
  return signal_length + 4;
}